

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ipstats.cpp
# Opt level: O0

IPStatsRecord * __thiscall IPStatsRecord::CreateCopy(IPStatsRecord *this)

{
  IPStatsRecord *this_00;
  IPStatsRecord *isr;
  IPStatsRecord *this_local;
  
  this_00 = (IPStatsRecord *)operator_new(0x368);
  IPStatsRecord(this_00);
  if (this_00 != (IPStatsRecord *)0x0) {
    this_00->ipaddr_length = this->ipaddr_length;
    this_00->query_volume = this->query_volume;
    this_00->arpa_count = this->arpa_count;
    this_00->no_such_domain_queries = this->no_such_domain_queries;
    this_00->no_such_domain_reserved = this->no_such_domain_reserved;
    this_00->no_such_domain_frequent = this->no_such_domain_frequent;
    this_00->no_such_domain_chromioids = this->no_such_domain_chromioids;
    memcpy(this_00->ip_addr,this->ip_addr,this->ipaddr_length);
    memcpy(this_00->hourly_volume,this->hourly_volume,0xc0);
    memcpy(this_00->daily_volume,this->daily_volume,0xf8);
    memcpy(this_00->tld_counts,this->tld_counts,0x40);
    HyperLogLog::AddLogs(&this_00->tld_hyperlog,&this->tld_hyperlog);
    memcpy(this_00->sld_counts,this->sld_counts,0x40);
    HyperLogLog::AddLogs(&this_00->sld_hyperlog,&this->sld_hyperlog);
    memcpy(this_00->name_parts,this->name_parts,0x40);
    memcpy(this_00->rr_types,this->rr_types,0x40);
    memcpy(this_00->locales,this->locales,0x40);
  }
  return this_00;
}

Assistant:

IPStatsRecord* IPStatsRecord::CreateCopy()
{
    IPStatsRecord * isr = new IPStatsRecord();

    if (isr != NULL) {
        isr->ipaddr_length = ipaddr_length;
        isr->query_volume = query_volume;
        isr->arpa_count = arpa_count;
        isr->no_such_domain_queries = no_such_domain_queries;
        isr->no_such_domain_reserved = no_such_domain_reserved;
        isr->no_such_domain_frequent = no_such_domain_frequent;
        isr->no_such_domain_chromioids = no_such_domain_chromioids;

        memcpy(isr->ip_addr, ip_addr, ipaddr_length);
        memcpy(isr->hourly_volume, hourly_volume, sizeof(hourly_volume));
        memcpy(isr->daily_volume, daily_volume, sizeof(daily_volume));
        memcpy(isr->tld_counts, tld_counts, sizeof(tld_counts));
        isr->tld_hyperlog.AddLogs(&tld_hyperlog);
        memcpy(isr->sld_counts, sld_counts, sizeof(sld_counts));
        isr->sld_hyperlog.AddLogs(&sld_hyperlog);
        memcpy(isr->name_parts, name_parts, sizeof(name_parts));
        memcpy(isr->rr_types, rr_types, sizeof(rr_types));
        memcpy(isr->locales, locales, sizeof(locales));
    }
    return isr;
}